

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_use_port(Curl_easy *data,ftpport fcmd)

{
  char cVar1;
  bool bVar2;
  unsigned_short uVar3;
  ushort uVar4;
  int iVar5;
  CURLcode CVar6;
  uint uVar7;
  if2ip_result_t iVar8;
  size_t in_RAX;
  char *pcVar9;
  char *pcVar10;
  int *piVar11;
  ulong uVar12;
  undefined6 extraout_var;
  undefined6 extraout_var_00;
  char *in_RCX;
  undefined8 uVar13;
  long lVar14;
  if2ip_result_t iVar15;
  connectdata *pcVar16;
  ftpport fVar17;
  char cVar18;
  Curl_easy *pCVar19;
  CURLcode error;
  char *pcVar20;
  Curl_addrinfo *ai;
  bool bVar21;
  curl_socket_t portsock;
  curl_socklen_t sslen;
  Curl_dns_entry *h;
  char myhost [47];
  Curl_sockaddr_storage ss;
  char target [67];
  char buffer [256];
  char hbuf [1025];
  curl_socket_t local_67c;
  connectdata *local_678;
  if2ip_result_t local_66c;
  if2ip_result_t local_668;
  socklen_t local_664;
  Curl_easy *local_660;
  undefined4 local_654;
  if2ip_result_t local_650;
  ftpport local_64c;
  pingpong *local_648;
  Curl_dns_entry *local_640;
  char local_638 [48];
  sockaddr local_608 [8];
  char local_588 [80];
  char local_538 [256];
  char local_438 [1032];
  
  pcVar16 = data->conn;
  local_67c = -1;
  local_638[0x20] = '\0';
  local_638[0x21] = '\0';
  local_638[0x22] = '\0';
  local_638[0x23] = '\0';
  local_638[0x24] = '\0';
  local_638[0x25] = '\0';
  local_638[0x26] = '\0';
  local_638[0x27] = '\0';
  local_638[0x28] = '\0';
  local_638[0x29] = '\0';
  local_638[0x2a] = '\0';
  local_638[0x2b] = '\0';
  local_638[0x2c] = '\0';
  local_638[0x2d] = '\0';
  local_638[0x2e] = '\0';
  local_638[0x10] = '\0';
  local_638[0x11] = '\0';
  local_638[0x12] = '\0';
  local_638[0x13] = '\0';
  local_638[0x14] = '\0';
  local_638[0x15] = '\0';
  local_638[0x16] = '\0';
  local_638[0x17] = '\0';
  local_638[0x18] = '\0';
  local_638[0x19] = '\0';
  local_638[0x1a] = '\0';
  local_638[0x1b] = '\0';
  local_638[0x1c] = '\0';
  local_638[0x1d] = '\0';
  local_638[0x1e] = '\0';
  local_638[0x1f] = 0;
  local_638[0] = '\0';
  local_638[1] = '\0';
  local_638[2] = '\0';
  local_638[3] = '\0';
  local_638[4] = '\0';
  local_638[5] = '\0';
  local_638[6] = '\0';
  local_638[7] = '\0';
  local_638[8] = '\0';
  local_638[9] = '\0';
  local_638[10] = '\0';
  local_638[0xb] = '\0';
  local_638[0xc] = '\0';
  local_638[0xd] = '\0';
  local_638[0xe] = '\0';
  local_638[0xf] = '\0';
  pcVar20 = (data->set).str[0xc];
  local_640 = (Curl_dns_entry *)0x0;
  local_678 = pcVar16;
  local_64c = fcmd;
  if ((pcVar20 == (char *)0x0) || (in_RAX = strlen(pcVar20), in_RAX < 2)) {
    iVar8 = (if2ip_result_t)in_RAX;
    pcVar20 = (char *)0x0;
    iVar15 = IF2IP_NOT_FOUND;
    local_668 = IF2IP_NOT_FOUND;
    pcVar9 = (char *)0x0;
    goto LAB_00132ff0;
  }
  in_RCX = (char *)(in_RAX + 1);
  pcVar9 = (char *)0x2f;
  if (0x2d < in_RAX) {
    pcVar9 = in_RCX;
  }
  pcVar9 = (char *)(*Curl_ccalloc)((size_t)pcVar9,1);
  if (pcVar9 == (char *)0x0) {
    iVar8 = 0x1b;
    iVar15 = IF2IP_NOT_FOUND;
    local_668 = IF2IP_NOT_FOUND;
LAB_001334f6:
    bVar21 = false;
    pcVar20 = (char *)0x0;
  }
  else {
    pcVar10 = pcVar20;
    if (*pcVar20 != ':') {
      if (*pcVar20 == '[') {
        pcVar10 = strchr(pcVar20,0x5d);
        if (pcVar10 != (char *)0x0) {
          pcVar20 = pcVar20 + 1;
LAB_0013337f:
          strncpy(pcVar9,pcVar20,(long)pcVar10 - (long)pcVar20);
          pcVar16 = local_678;
          goto LAB_00133398;
        }
      }
      else {
        pcVar10 = strchr(pcVar20,0x3a);
        if ((pcVar10 != (char *)0x0) && (iVar5 = inet_pton(10,pcVar20,local_608), iVar5 != 1))
        goto LAB_0013337f;
        strcpy(pcVar9,pcVar20);
      }
      pcVar10 = (char *)0x0;
      pcVar16 = local_678;
    }
LAB_00133398:
    if (pcVar10 == (char *)0x0) {
      iVar15 = IF2IP_NOT_FOUND;
      iVar8 = IF2IP_NOT_FOUND;
    }
    else {
      pcVar20 = strchr(pcVar10,0x3a);
      if (pcVar20 == (char *)0x0) {
        iVar15 = IF2IP_NOT_FOUND;
        pcVar16 = local_678;
        iVar8 = IF2IP_NOT_FOUND;
      }
      else {
        uVar12 = strtoul(pcVar20 + 1,(char **)0x0,10);
        uVar3 = curlx_ultous(uVar12);
        iVar15 = (if2ip_result_t)CONCAT62(extraout_var,uVar3);
        pcVar20 = strchr(pcVar20,0x2d);
        pcVar16 = local_678;
        iVar8 = iVar15;
        if (pcVar20 != (char *)0x0) {
          uVar12 = strtoul(pcVar20 + 1,(char **)0x0,10);
          uVar3 = curlx_ultous(uVar12);
          pcVar16 = local_678;
          iVar8 = (if2ip_result_t)CONCAT62(extraout_var_00,uVar3);
        }
      }
    }
    if ((ushort)iVar8 < (ushort)iVar15) {
      iVar8 = IF2IP_NOT_FOUND;
      iVar15 = IF2IP_NOT_FOUND;
    }
    bVar21 = true;
    pcVar20 = (char *)0x0;
    local_668 = iVar8;
    if (*pcVar9 != '\0') {
      iVar5 = pcVar16->ip_addr->ai_family;
      local_66c = iVar15;
      uVar7 = Curl_ipv6_scope(pcVar16->ip_addr->ai_addr);
      in_RCX = pcVar9;
      iVar8 = Curl_if2ip(iVar5,uVar7,pcVar16->scope_id,pcVar9,local_438,0x401);
      pcVar16 = local_678;
      pcVar20 = local_438;
      iVar15 = local_66c;
      if (iVar8 != IF2IP_FOUND) {
        if (iVar8 == IF2IP_AF_NOT_SUPPORTED) {
          iVar8 = 0x1e;
          goto LAB_001334f6;
        }
        pcVar20 = pcVar9;
        if (iVar8 != IF2IP_NOT_FOUND) {
          pcVar20 = (char *)0x0;
        }
      }
    }
  }
  if (!bVar21) {
    return iVar8;
  }
LAB_00132ff0:
  uVar13 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  local_654 = (undefined4)uVar13;
  if (pcVar20 == (char *)0x0) {
    local_664 = 0x80;
    iVar5 = getsockname(pcVar16->sock[0],local_608,&local_664);
    if (iVar5 == 0) {
      pcVar20 = local_438;
      uVar13 = 0x401;
      pcVar10 = inet_ntop((uint)local_608[0].sa_family,
                          local_608[0].sa_data + (ulong)(local_608[0].sa_family == 10) * 4 + 2,
                          pcVar20,0x401);
      bVar21 = pcVar10 == (char *)0x0;
      local_654 = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),bVar21);
      if (bVar21) {
        pcVar20 = (char *)0x0;
      }
      bVar2 = !bVar21;
      if (bVar21) {
        iVar8 = 0x1e;
      }
    }
    else {
      piVar11 = __errno_location();
      pcVar10 = Curl_strerror(*piVar11,local_538,0x100);
      pcVar20 = (char *)0x0;
      Curl_failf(data,"getsockname() failed: %s",pcVar10);
      (*Curl_cfree)(pcVar9);
      iVar8 = 0x1e;
      local_654 = (undefined4)CONCAT71((int7)((ulong)uVar13 >> 8),1);
      bVar2 = false;
    }
    if (!bVar2) {
      return iVar8;
    }
  }
  ai = (Curl_addrinfo *)0x0;
  local_650 = iVar8;
  Curl_resolv(data,pcVar20,0,false,&local_640);
  if (local_640 != (Curl_dns_entry *)0x0) {
    ai = local_640->addr;
    Curl_resolv_unlock(data,local_640);
  }
  if (ai == (Curl_addrinfo *)0x0) {
    Curl_failf(data,"failed to resolve the address provided to PORT: %s",pcVar20);
    (*Curl_cfree)(pcVar9);
  }
  else {
    local_66c = iVar15;
    (*Curl_cfree)(pcVar9);
    local_67c = -1;
    iVar5 = 0;
    local_660 = data;
    CVar6 = Curl_socket(data,ai,(Curl_sockaddr_ex *)0x0,&local_67c);
    if (CVar6 == CURLE_OK) {
      bVar21 = false;
      error = CURLE_OK;
    }
    else {
      piVar11 = __errno_location();
      do {
        error = CVar6;
        iVar5 = *piVar11;
        ai = ai->ai_next;
        bVar21 = ai == (Curl_addrinfo *)0x0;
        if (bVar21) break;
        error = CURLE_OK;
        CVar6 = Curl_socket(local_660,ai,(Curl_sockaddr_ex *)0x0,&local_67c);
      } while (CVar6 != CURLE_OK);
    }
    if (bVar21) {
      pcVar20 = Curl_strerror(iVar5,local_538,0x100);
      Curl_failf(local_660,"socket failure: %s",pcVar20);
    }
    else {
      memcpy(local_608,ai->ai_addr,(ulong)ai->ai_addrlen);
      local_664 = ai->ai_addrlen;
      if ((ushort)local_668 < (ushort)(undefined2)local_66c) {
LAB_001331ee:
        pCVar19 = local_660;
        Curl_failf(local_660,"bind() failed, we ran out of ports");
        pcVar16 = local_678;
      }
      else {
        local_648 = (pingpong *)&local_678->proto;
        do {
          bVar21 = false;
          iVar15 = local_66c;
          while( true ) {
            local_608[0].sa_data._0_2_ = (ushort)iVar15 << 8 | (ushort)iVar15 >> 8;
            iVar5 = bind(local_67c,local_608,local_664);
            if (iVar5 == 0) {
              if (bVar21) goto LAB_001331ee;
              local_664 = 0x80;
              iVar5 = getsockname(local_67c,local_608,&local_664);
              if (iVar5 != 0) {
                piVar11 = __errno_location();
                pcVar20 = Curl_strerror(*piVar11,local_538,0x100);
                pCVar19 = local_660;
                Curl_failf(local_660,"getsockname() failed: %s",pcVar20);
                pcVar16 = local_678;
                goto LAB_00133210;
              }
              iVar5 = listen(local_67c,1);
              pcVar16 = local_678;
              if (iVar5 != 0) {
                piVar11 = __errno_location();
                pcVar20 = Curl_strerror(*piVar11,local_538,0x100);
                pcVar9 = "socket failure: %s";
                goto LAB_0013358a;
              }
              Curl_printable_address(ai,local_638,0x2f);
              pCVar19 = local_660;
              uVar7 = *(uint *)&(pcVar16->bits).field_0x4;
              if ((uVar7 & 0x81000) == 0x1000) {
                *(uint *)&(pcVar16->bits).field_0x4 = uVar7 | 0x80000;
              }
              fVar17 = local_64c;
              if (local_64c == DONE) goto LAB_00133653;
              uVar4 = local_608[0].sa_data._0_2_ << 8 | (ushort)local_608[0].sa_data._0_2_ >> 8;
              goto LAB_00133612;
            }
            piVar11 = __errno_location();
            iVar5 = *piVar11;
            if ((iVar5 == 99 & (byte)local_654) == 1) break;
            if ((iVar5 != 0xd) && (iVar5 != 0x62)) {
              pcVar20 = Curl_strerror(iVar5,local_538,0x100);
              pCVar19 = local_660;
              Curl_failf(local_660,"bind(port=%hu) failed: %s",(ulong)(iVar15 & 0xffff),pcVar20);
              pcVar16 = local_678;
              goto LAB_00133210;
            }
            iVar15 = iVar15 + IF2IP_AF_NOT_SUPPORTED;
            bVar21 = (ushort)(undefined2)local_668 < (ushort)iVar15;
            if ((ushort)(undefined2)local_668 < (ushort)iVar15) goto LAB_001331ee;
          }
          pcVar20 = Curl_strerror(99,local_538,0x100);
          local_654 = 0;
          Curl_infof(local_660,"bind(port=%hu) on non-local address failed: %s",
                     (ulong)(iVar15 & 0xffff),pcVar20);
          pcVar16 = local_678;
          local_664 = 0x80;
          iVar5 = getsockname(local_678->sock[0],local_608,&local_664);
        } while (iVar5 == 0);
        pcVar20 = Curl_strerror(*piVar11,local_538,0x100);
        pcVar9 = "getsockname() failed: %s";
LAB_0013358a:
        pCVar19 = local_660;
        Curl_failf(local_660,pcVar9,pcVar20);
      }
LAB_00133210:
      Curl_closesocket(pCVar19,pcVar16,local_67c);
    }
  }
  return CURLE_FTP_PORT_FAILED;
LAB_00133612:
  do {
    if ((((*(uint *)&(pcVar16->bits).field_0x4 & 0x80000) != 0 || fVar17 != EPRT) &&
        (fVar17 != PORT || local_608[0].sa_family == 2)) &&
       ((local_608[0].sa_family == 2 || (local_608[0].sa_family == 10)))) {
      if (fVar17 == EPRT) {
        error = CURLE_OK;
        CVar6 = Curl_pp_sendf(local_660,local_648,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                              (ulong)((local_608[0].sa_family != 2) + 1),local_638,(uint)uVar4);
        if (CVar6 != CURLE_OK) {
          pcVar20 = curl_easy_strerror(CVar6);
          Curl_failf(pCVar19,"Failure sending EPRT command: %s",pcVar20);
          Curl_closesocket(pCVar19,pcVar16,local_67c);
          (pcVar16->proto).ftpc.count1 = 1;
          (pCVar19->conn->proto).ftpc.state = FTP_STOP;
          return CVar6;
        }
        goto LAB_00133653;
      }
      if (fVar17 == PORT) {
        lVar14 = 0;
        while( true ) {
          cVar1 = local_638[lVar14];
          cVar18 = ',';
          if ((cVar1 != '.') && (cVar18 = cVar1, cVar1 == '\0')) break;
          local_588[lVar14] = cVar18;
          lVar14 = lVar14 + 1;
        }
        local_588[lVar14] = '\0';
        curl_msnprintf(local_588 + lVar14,0x14,",%d,%d",(ulong)(local_608[0].sa_data._0_2_ & 0xff),
                       (ulong)uVar4 & 0xff);
        error = Curl_pp_sendf(pCVar19,local_648,"%s %s",0x166a61,local_588);
        if (error != CURLE_OK) {
          pcVar20 = curl_easy_strerror(error);
          Curl_failf(pCVar19,"Failure sending PORT command: %s",pcVar20);
          Curl_closesocket(pCVar19,pcVar16,local_67c);
          (pCVar19->conn->proto).ftpc.state = FTP_STOP;
          return error;
        }
        goto LAB_00133653;
      }
    }
    fVar17 = fVar17 + PORT;
  } while (fVar17 != DONE);
  fVar17 = DONE;
LAB_00133653:
  (pcVar16->proto).ftpc.count1 = fVar17;
  if (pcVar16->sock[1] != -1) {
    Curl_closesocket(pCVar19,pcVar16,pcVar16->sock[1]);
    pcVar16->sock[1] = -1;
  }
  (pcVar16->bits).tcpconnect[1] = false;
  (pcVar16->bits).proxy_ssl_connected[1] = false;
  pcVar16->sock[1] = local_67c;
  (pcVar16->bits).tcpconnect[1] = true;
  (pCVar19->conn->proto).ftpc.state = FTP_PORT;
  return error;
}

Assistant:

static CURLcode ftp_state_use_port(struct Curl_easy *data,
                                   ftpport fcmd) /* start with this */
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[MAX_IPADR_LEN + 1] = "";

  struct Curl_sockaddr_storage ss;
  struct Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  static const char mode[][5] = { "EPRT", "PORT" };
  enum resolve_t rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen + 1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      ip_end = strchr(string_ftpport, ']');
      if(ip_end)
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            strcpy(addr, string_ftpport);
            ip_end = NULL; /* this got no port ! */
          }
          else
#endif
            /* (ipv4|domain|interface):port(-range) */
            strncpy(addr, string_ftpport, ip_end - ip_start);
        }
        else
          /* ipv4|interface */
          strcpy(addr, string_ftpport);
      }

    /* parse the port */
    if(ip_end) {
      port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
#ifdef ENABLE_IPV6
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id,
#endif
                        addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    const char *r;
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      r = Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      r = Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    if(!r)
      return CURLE_FTP_PORT_FAILED;
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(data, host, 0, FALSE, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(data, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(!res) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(data, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          Curl_closesocket(data, conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        Curl_closesocket(data, conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports");
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(data, conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(data, &ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
    if(PORT == fcmd) {
      /* large enough for [IP address],[num],[num] */
      char target[sizeof(myhost) + 20];
      char *source = myhost;
      char *dest = target;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(data, &ftpc->pp, "%s %s", mode[fcmd], target);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(data, conn, portsock);
        /* bail out */
        state(data, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  close_secondarysocket(data, conn);

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(data, FTP_PORT);
  return result;
}